

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  cmMessenger *messenger;
  cmTargetInternals *pcVar7;
  ostream *poVar8;
  char *local_d48;
  byte local_d31;
  string local_bb8;
  ostringstream local_b98 [8];
  ostringstream e_5;
  allocator local_a19;
  string local_a18;
  allocator local_9f1;
  value_type local_9f0;
  undefined1 local_9d0 [8];
  cmListFileBacktrace lfbt_5;
  value_type local_9a8;
  undefined1 local_988 [8];
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  value_type local_940;
  undefined1 local_920 [8];
  cmListFileBacktrace lfbt_2;
  value_type local_8f8;
  undefined1 local_8d8 [8];
  cmListFileBacktrace lfbt_1;
  value_type local_8b0;
  undefined1 local_890 [8];
  cmListFileBacktrace lfbt;
  value_type local_868;
  string local_848;
  ostringstream local_828 [8];
  ostringstream e_4;
  string local_6b0;
  ostringstream local_690 [8];
  ostringstream e_3;
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream e_2;
  string local_380;
  ostringstream local_360 [8];
  ostringstream e_1;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream e;
  cmListFileBacktrace local_40;
  char *local_20;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  TVar6 = GetType(this);
  pcVar3 = value_local;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace(&local_40,this->Makefile);
  bVar4 = cmTargetPropertyComputer::PassesWhitelist(TVar6,(string *)pcVar3,messenger,&local_40);
  cmListFileBacktrace::~cmListFileBacktrace(&local_40);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"MANUALLY_ADDED_DEPENDENCIES");
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::operator<<((ostream *)local_1c8,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"NAME");
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream(local_360);
        std::operator<<((ostream *)local_360,"NAME property is read-only\n");
        pcVar1 = this->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::ostringstream::~ostringstream(local_360);
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"TYPE");
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream(local_4f8);
          std::operator<<((ostream *)local_4f8,"TYPE property is read-only\n");
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::ostringstream::~ostringstream(local_4f8);
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,"EXPORT_NAME");
          if ((bVar4) && (bVar4 = IsImported(this), bVar4)) {
            std::__cxx11::ostringstream::ostringstream(local_690);
            poVar8 = std::operator<<((ostream *)local_690,
                                     "EXPORT_NAME property can\'t be set on imported targets (\"");
            poVar8 = std::operator<<(poVar8,(string *)&this->Name);
            std::operator<<(poVar8,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_6b0);
            std::__cxx11::string::~string((string *)&local_6b0);
            std::__cxx11::ostringstream::~ostringstream(local_690);
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,"SOURCES");
            if ((bVar4) && (bVar4 = IsImported(this), bVar4)) {
              std::__cxx11::ostringstream::ostringstream(local_828);
              poVar8 = std::operator<<((ostream *)local_828,
                                       "SOURCES property can\'t be set on imported targets (\"");
              poVar8 = std::operator<<(poVar8,(string *)&this->Name);
              std::operator<<(poVar8,"\")\n");
              pcVar1 = this->Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_848);
              std::__cxx11::string::~string((string *)&local_848);
              std::__cxx11::ostringstream::~ostringstream(local_828);
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,"INCLUDE_DIRECTORIES");
              if (bVar4) {
                pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&pcVar7->IncludeDirectoriesEntries);
                pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                          (&pcVar7->IncludeDirectoriesBacktraces);
                if (local_20 != (char *)0x0) {
                  pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                  pcVar3 = local_20;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_868,pcVar3,(allocator *)((long)&lfbt.Cur + 7));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&pcVar7->IncludeDirectoriesEntries,&local_868);
                  std::__cxx11::string::~string((string *)&local_868);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt.Cur + 7));
                  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_890,this->Makefile);
                  pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&pcVar7->IncludeDirectoriesBacktraces,(value_type *)local_890);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_890);
                }
              }
              else {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,"COMPILE_OPTIONS");
                if (bVar4) {
                  pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&pcVar7->CompileOptionsEntries);
                  pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&pcVar7->CompileOptionsBacktraces);
                  if (local_20 != (char *)0x0) {
                    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                    pcVar3 = local_20;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_8b0,pcVar3,(allocator *)((long)&lfbt_1.Cur + 7));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&pcVar7->CompileOptionsEntries,&local_8b0);
                    std::__cxx11::string::~string((string *)&local_8b0);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_1.Cur + 7));
                    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_8d8,this->Makefile);
                    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar7->CompileOptionsBacktraces,(value_type *)local_8d8);
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_8d8);
                  }
                }
                else {
                  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,"COMPILE_FEATURES");
                  if (bVar4) {
                    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear(&pcVar7->CompileFeaturesEntries);
                    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&pcVar7->CompileFeaturesBacktraces);
                    if (local_20 != (char *)0x0) {
                      pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                      pcVar3 = local_20;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_8f8,pcVar3,(allocator *)((long)&lfbt_2.Cur + 7));
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&pcVar7->CompileFeaturesEntries,&local_8f8);
                      std::__cxx11::string::~string((string *)&local_8f8);
                      std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_2.Cur + 7));
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_920,this->Makefile);
                      pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar7->CompileFeaturesBacktraces,(value_type *)local_920);
                      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_920);
                    }
                  }
                  else {
                    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,"COMPILE_DEFINITIONS");
                    if (bVar4) {
                      pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&pcVar7->CompileDefinitionsEntries);
                      pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&pcVar7->CompileDefinitionsBacktraces);
                      if (local_20 != (char *)0x0) {
                        pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                        pcVar3 = local_20;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_940,pcVar3,(allocator *)((long)&lfbt_3.Cur + 7))
                        ;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(&pcVar7->CompileDefinitionsEntries,&local_940);
                        std::__cxx11::string::~string((string *)&local_940);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_3.Cur + 7))
                        ;
                        cmMakefile::GetBacktrace((cmListFileBacktrace *)&lfbt_4.Cur,this->Makefile);
                        pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&pcVar7->CompileDefinitionsBacktraces,(value_type *)&lfbt_4.Cur);
                        cmListFileBacktrace::~cmListFileBacktrace
                                  ((cmListFileBacktrace *)&lfbt_4.Cur);
                      }
                    }
                    else {
                      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value_local,"LINK_LIBRARIES");
                      if (bVar4) {
                        pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear(&pcVar7->LinkImplementationPropertyEntries);
                        pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        clear(&pcVar7->LinkImplementationPropertyBacktraces);
                        if (local_20 != (char *)0x0) {
                          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_988,this->Makefile);
                          pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                          pcVar3 = local_20;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_9a8,pcVar3,
                                     (allocator *)((long)&lfbt_5.Cur + 7));
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&pcVar7->LinkImplementationPropertyEntries,&local_9a8);
                          std::__cxx11::string::~string((string *)&local_9a8);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&lfbt_5.Cur + 7));
                          pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&pcVar7->LinkImplementationPropertyBacktraces,
                                    (value_type *)local_988);
                          cmListFileBacktrace::~cmListFileBacktrace
                                    ((cmListFileBacktrace *)local_988);
                        }
                      }
                      else {
                        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)value_local,"SOURCES");
                        if (bVar4) {
                          pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::clear(&pcVar7->SourceEntries);
                          pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          clear(&pcVar7->SourceBacktraces);
                          if (local_20 != (char *)0x0) {
                            cmMakefile::GetBacktrace
                                      ((cmListFileBacktrace *)local_9d0,this->Makefile);
                            pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                            pcVar3 = local_20;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string((string *)&local_9f0,pcVar3,&local_9f1);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&pcVar7->SourceEntries,&local_9f0);
                            std::__cxx11::string::~string((string *)&local_9f0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
                            pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar7->SourceBacktraces,(value_type *)local_9d0);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)local_9d0);
                          }
                        }
                        else {
                          bVar5 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)value_local,(char (*) [17])"IMPORTED_LIBNAME");
                          pcVar3 = value_local;
                          bVar2 = false;
                          bVar4 = false;
                          local_d31 = 0;
                          if (bVar5) {
                            if (local_20 == (char *)0x0) {
                              local_d48 = "";
                            }
                            else {
                              local_d48 = local_20;
                            }
                            std::allocator<char>::allocator();
                            bVar2 = true;
                            std::__cxx11::string::string((string *)&local_a18,local_d48,&local_a19);
                            bVar4 = true;
                            bVar5 = CheckImportedLibName(this,(string *)pcVar3,&local_a18);
                            local_d31 = bVar5 ^ 0xff;
                          }
                          if (bVar4) {
                            std::__cxx11::string::~string((string *)&local_a18);
                          }
                          if (bVar2) {
                            std::allocator<char>::~allocator((allocator<char> *)&local_a19);
                          }
                          if ((local_d31 & 1) == 0) {
                            bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,"CUDA_PTX_COMPILATION");
                            if ((bVar4) && (TVar6 = GetType(this), TVar6 != OBJECT_LIBRARY)) {
                              std::__cxx11::ostringstream::ostringstream(local_b98);
                              poVar8 = std::operator<<((ostream *)local_b98,
                                                                                                              
                                                  "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                  );
                              poVar8 = std::operator<<(poVar8,(string *)&this->Name);
                              std::operator<<(poVar8,"\")\n");
                              pcVar1 = this->Makefile;
                              std::__cxx11::ostringstream::str();
                              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_bb8);
                              std::__cxx11::string::~string((string *)&local_bb8);
                              std::__cxx11::ostringstream::~ostringstream(local_b98);
                            }
                            else {
                              cmPropertyMap::SetProperty
                                        (&this->Properties,(string *)value_local,local_20);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "MANUALLY_ADDED_DEPENDENCIES") {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "TYPE") {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  if (prop == "INCLUDE_DIRECTORIES") {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value) {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value) {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value) {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.push_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == "CUDA_PTX_COMPILATION" &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}